

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeView::setFirstColumnSpanned(QTreeView *this,int row,QModelIndex *parent,bool span)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  uint uVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QPersistentModelIndex local_50;
  QModelIndex local_48;
  QHashDummyValue local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
  if (pQVar1 != (QAbstractItemModel *)0x0) {
    local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.r = -0x55555556;
    local_48.c = -0x55555556;
    local_48.i._0_4_ = 0xaaaaaaaa;
    local_48.i._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_48,pQVar1,row,0,parent);
    if (((-1 < local_48.r) && (-1 < local_48.c)) && (local_48.m.ptr != (QAbstractItemModel *)0x0)) {
      if (span) {
        QPersistentModelIndex::QPersistentModelIndex(&local_50,&local_48);
        QHash<QPersistentModelIndex,_QHashDummyValue>::emplace<QHashDummyValue>
                  (&(this_00->spanningIndexes).q_hash,&local_50,&local_29);
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex(&local_50,&local_48);
        QHash<QPersistentModelIndex,_QHashDummyValue>::removeImpl<QPersistentModelIndex>
                  (&(this_00->spanningIndexes).q_hash,&local_50);
      }
      QPersistentModelIndex::~QPersistentModelIndex(&local_50);
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      uVar2 = QTreeViewPrivate::viewIndex(this_00,&local_48);
      if (-1 < (int)uVar2) {
        pQVar3 = QList<QTreeViewItem>::data(&this_00->viewItems);
        *(ulong *)&pQVar3[uVar2].field_0x1c =
             (*(ulong *)&pQVar3[uVar2].field_0x1c & 0xfffffffffffffffd) + (ulong)span * 2;
      }
      QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      viewport);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setFirstColumnSpanned(int row, const QModelIndex &parent, bool span)
{
    Q_D(QTreeView);
    if (!d->model)
        return;
    const QModelIndex index = d->model->index(row, 0, parent);
    if (!index.isValid())
        return;

    if (span)
        d->spanningIndexes.insert(index);
    else
        d->spanningIndexes.remove(index);

    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (i >= 0)
        d->viewItems[i].spanning = span;

    d->viewport->update();
}